

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_validate.cpp
# Opt level: O0

void __thiscall
ktx::CommandValidate::OptionsValidate::process
          (OptionsValidate *this,Options *param_2,ParseResult *args,Reporter *param_4)

{
  bool *pbVar1;
  ParseResult *in_RDX;
  string *in_RDI;
  allocator<char> *__s;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff80;
  string local_78 [8];
  OptionValue *in_stack_ffffffffffffff90;
  allocator<char> local_41;
  string local_40 [64];
  
  __s = &local_41;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffff80,(char *)__s,(allocator<char> *)in_RDX);
  cxxopts::ParseResult::operator[](in_RDX,in_RDI);
  pbVar1 = cxxopts::OptionValue::as<bool>(in_stack_ffffffffffffff90);
  in_RDI->_M_dataplus = (_Alloc_hider)(*pbVar1 & 1);
  std::__cxx11::string::~string(local_40);
  std::allocator<char>::~allocator(&local_41);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffff80,(char *)__s,(allocator<char> *)in_RDX);
  cxxopts::ParseResult::operator[](in_RDX,in_RDI);
  pbVar1 = cxxopts::OptionValue::as<bool>(in_stack_ffffffffffffff90);
  in_RDI->field_0x1 = *pbVar1 & 1;
  std::__cxx11::string::~string(local_78);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff87);
  return;
}

Assistant:

void process(cxxopts::Options&, cxxopts::ParseResult& args, Reporter&) {
            warningsAsErrors = args["warnings-as-errors"].as<bool>();
            GLTFBasisU = args["gltf-basisu"].as<bool>();
        }